

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CordInputStream::ReadCord(CordInputStream *this,Cord *cord,int count)

{
  Cord *this_00;
  unsigned_long *puVar1;
  undefined1 local_48 [32];
  size_t n;
  size_t used;
  Cord *pCStack_18;
  int count_local;
  Cord *cord_local;
  CordInputStream *this_local;
  
  n = this->size_ - this->available_;
  used._4_4_ = count;
  pCStack_18 = cord;
  cord_local = (Cord *)this;
  absl::lts_20250127::Cord::Advance(&this->it_,n);
  local_48._16_8_ = SEXT48(used._4_4_);
  puVar1 = std::min<unsigned_long>((unsigned_long *)(local_48 + 0x10),&this->bytes_remaining_);
  this_00 = pCStack_18;
  local_48._24_8_ = *puVar1;
  absl::lts_20250127::Cord::AdvanceAndRead((Nonnull<CharIterator_*>)local_48,(size_t)&this->it_);
  absl::lts_20250127::Cord::Append(this_00,(Cord *)local_48);
  absl::lts_20250127::Cord::~Cord((Cord *)local_48);
  this->bytes_remaining_ = this->bytes_remaining_ - local_48._24_8_;
  LoadChunkData(this);
  return local_48._24_8_ == (long)used._4_4_;
}

Assistant:

bool CordInputStream::ReadCord(absl::Cord* cord, int count) {
  // Advance the iterator to the current position
  const size_t used = size_ - available_;
  absl::Cord::Advance(&it_, used);

  // Read the cord, adjusting the iterator position.
  // Make sure to cap at available bytes to avoid hard crashes.
  const size_t n = std::min(static_cast<size_t>(count), bytes_remaining_);
  cord->Append(absl::Cord::AdvanceAndRead(&it_, n));

  // Update current chunk data.
  bytes_remaining_ -= n;
  LoadChunkData();

  return n == static_cast<size_t>(count);
}